

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::StratifiedSampler::Get2D(StratifiedSampler *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  uint64_t uVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint64_t oldstate;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar9 = (long)this->seed ^ (long)this->dimension << 0x10 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
          (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30;
  uVar9 = (uVar9 >> 0x1f ^ uVar9) * 0x7fb5d329728ea185;
  lVar7 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
  uVar6 = this->sampleIndex;
  uVar8 = (uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7;
  uVar1 = this->xPixelSamples;
  uVar3 = this->yPixelSamples;
  auVar13._4_4_ = uVar3;
  auVar13._0_4_ = uVar1;
  uVar10 = uVar3 * uVar1;
  uVar12 = uVar10 - 1 >> 1 | uVar10 - 1;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  do {
    uVar6 = (uVar6 ^ uVar8) * -0x1e8f76c3 ^ uVar8 >> 0x10;
    uVar6 = ((uVar6 & uVar12) >> 4 ^ uVar8 >> 8 ^ uVar6) * 0x929eb3f ^ uVar8 >> 0x17;
    uVar6 = ((uVar6 & uVar12) >> 1 ^ uVar6) * (uVar8 >> 0x1b | 1) * 0x6935fa69;
    uVar6 = ((uVar6 & uVar12) >> 0xb ^ uVar6) * 0x74dcb303;
    uVar6 = ((uVar6 & uVar12) >> 2 ^ uVar6) * -0x61afe33d;
    uVar6 = ((uVar6 & uVar12) >> 2 ^ uVar6) * -0x379f5c21 & uVar12;
    uVar6 = uVar6 >> 5 ^ uVar6;
  } while (uVar10 <= uVar6);
  this->dimension = this->dimension + 2;
  if (this->jitter == true) {
    uVar9 = (this->rng).state;
    uVar2 = (this->rng).inc;
    uVar11 = uVar9 * 0x5851f42d4c957f2d + uVar2;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar9;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar11;
    auVar15 = vpunpcklqdq_avx(auVar14,auVar17);
    auVar4 = vpsrlvq_avx2(auVar15,_DAT_0044e860);
    auVar5 = vpsrlvq_avx2(auVar15,_DAT_0044e870);
    auVar15 = vpsrlq_avx(auVar15,0x3b);
    auVar15 = vpshufd_avx(auVar15,0xe8);
    (this->rng).state = uVar11 * 0x5851f42d4c957f2d + uVar2;
    auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
    auVar15 = vprorvd_avx512vl(auVar4,auVar15);
    auVar15 = vcvtudq2ps_avx512vl(auVar15);
    auVar4._8_4_ = 0x2f800000;
    auVar4._0_8_ = 0x2f8000002f800000;
    auVar4._12_4_ = 0x2f800000;
    auVar15 = vmulps_avx512vl(auVar15,auVar4);
    auVar5._8_4_ = 0x3f7fffff;
    auVar5._0_8_ = 0x3f7fffff3f7fffff;
    auVar5._12_4_ = 0x3f7fffff;
    auVar15 = vminps_avx512vl(auVar15,auVar5);
  }
  else {
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
  }
  auVar13._8_8_ = 0;
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar10 = (uVar6 + uVar8) % uVar10;
  auVar4 = vpinsrd_avx(ZEXT416((uint)((int)uVar10 % (int)uVar1)),(int)uVar10 / (int)uVar1,1);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar16._0_4_ = auVar15._0_4_ + auVar4._0_4_;
  auVar16._4_4_ = auVar15._4_4_ + auVar4._4_4_;
  auVar16._8_4_ = auVar15._8_4_ + auVar4._8_4_;
  auVar16._12_4_ = auVar15._12_4_ + auVar4._12_4_;
  auVar13 = vdivps_avx(auVar16,auVar13);
  return (Point2f)auVar13._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Compute _stratum_ index for current pixel and dimension
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ seed);
        int stratum = PermutationElement(sampleIndex, SamplesPerPixel(), hash);

        dimension += 2;
        int x = stratum % xPixelSamples, y = stratum / xPixelSamples;
        Float dx = jitter ? rng.Uniform<Float>() : 0.5f;
        Float dy = jitter ? rng.Uniform<Float>() : 0.5f;
        return {(x + dx) / xPixelSamples, (y + dy) / yPixelSamples};
    }